

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

char IF97::Region3Backwards::BackwardsRegion3SubRegionDetermination(double T,double p)

{
  out_of_range *this;
  char cVar1;
  double dVar2;
  
  if (22.5 < p) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Out of range");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if ((p <= 22.11) || (22.5 < p)) {
    if ((p <= 22.064) || (22.11 < p)) {
      dVar2 = Tsat97(p);
      if (T <= dVar2) {
        if (p <= 21.93161551) {
          return 'U';
        }
        if (p <= 22.064) {
          dVar2 = DividingLine(LINE_QU,p);
          if ((dVar2 < T) && (dVar2 = DividingLine(LINE_UV,p), T <= dVar2)) {
            return 'U';
          }
          dVar2 = DividingLine(LINE_UV,p);
          if (dVar2 < T) {
            return 'Y';
          }
          return '?';
        }
        return 'U';
      }
      if (p <= 21.90096265) {
        return 'X';
      }
      if (22.064 < p) {
        return 'X';
      }
      dVar2 = DividingLine(LINE_WX,p);
      if (T <= dVar2) {
        return 'Z';
      }
      dVar2 = DividingLine(LINE_WX,p);
      if (T <= dVar2) {
        return '?';
      }
      dVar2 = DividingLine(LINE_RX,p);
      goto joined_r0x0011710c;
    }
    dVar2 = DividingLine(LINE_QU,p);
    if ((dVar2 < T) && (dVar2 = DividingLine(LINE_UV,p), T <= dVar2)) {
      return 'U';
    }
    dVar2 = DividingLine(LINE_UV,p);
    if ((dVar2 < T) && (dVar2 = DividingLine(LINE_EF,p), T <= dVar2)) {
      return 'Y';
    }
    dVar2 = DividingLine(LINE_EF,p);
    if (dVar2 < T) {
      dVar2 = DividingLine(LINE_WX,p);
      cVar1 = 'Z';
      goto LAB_00117053;
    }
  }
  else {
    dVar2 = DividingLine(LINE_QU,p);
    if ((dVar2 < T) && (dVar2 = DividingLine(LINE_UV,p), T <= dVar2)) {
      return 'U';
    }
    dVar2 = DividingLine(LINE_UV,p);
    if ((dVar2 < T) && (dVar2 = DividingLine(LINE_EF,p), T <= dVar2)) {
      return 'V';
    }
    dVar2 = DividingLine(LINE_EF,p);
    if (dVar2 < T) {
      dVar2 = DividingLine(LINE_WX,p);
      cVar1 = 'W';
LAB_00117053:
      if (T <= dVar2) {
        return cVar1;
      }
    }
  }
  dVar2 = DividingLine(LINE_WX,p);
  if (T <= dVar2) {
    return '?';
  }
  dVar2 = DividingLine(LINE_RX,p);
joined_r0x0011710c:
  if (dVar2 < T) {
    return '?';
  }
  return 'X';
}

Assistant:

inline char BackwardsRegion3SubRegionDetermination(double T, double p){

            if (p > 22.5*p_fact){
               throw std::out_of_range("Out of range");
            }
            else if (22.11*p_fact < p && p <= 22.5*p_fact){
                // Supercritical
                if (DividingLine(LINE_QU, p) < T && T <= DividingLine(LINE_UV, p)){ return 'U';}
                else if (DividingLine(LINE_UV, p) < T && T <= DividingLine(LINE_EF, p)){ return 'V';}
                else if (DividingLine(LINE_EF, p) < T && T <= DividingLine(LINE_WX, p)){ return 'W';}
                else if (DividingLine(LINE_WX, p) < T && T <= DividingLine(LINE_RX, p)){ return 'X';}
                else {return '?';}
            }
            else if (22.064*p_fact < p && p <= 22.11*p_fact){
                // Supercritical
                if (DividingLine(LINE_QU, p) < T && T <= DividingLine(LINE_UV, p)){ return 'U';}
                else if (DividingLine(LINE_UV, p) < T && T <= DividingLine(LINE_EF, p)){ return 'Y';}
                else if (DividingLine(LINE_EF, p) < T && T <= DividingLine(LINE_WX, p)){ return 'Z';}
                else if (DividingLine(LINE_WX, p) < T && T <= DividingLine(LINE_RX, p)){ return 'X';}
                else {return '?';}
            }
            else if (T <= Tsat97(p)){
                if (21.93161551*p_fact < p && p <= 22.064*p_fact){
                    // Sub-critical
                    if (DividingLine(LINE_QU, p) < T && T <= DividingLine(LINE_UV, p)){ return 'U';}
                    else if (DividingLine(LINE_UV, p) < T ){ return 'Y';}
                    else {return '?';}
                }
                else{
                    return 'U';
                }
            }
            else{
                if (21.90096265*p_fact < p && p <= 22.064*p_fact){
                    // Sub-critical
                    if (T <= DividingLine(LINE_WX, p)){ return 'Z';}
                    else if (DividingLine(LINE_WX, p) < T && T <= DividingLine(LINE_RX, p)){ return 'X';}
                    else {return '?';}
                }
                else{
                    return 'X';
                }
            }
        }